

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

StringPtr __thiscall kj::HttpHeaderId::toString(HttpHeaderId *this)

{
  StringPtr *pSVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  StringPtr SVar4;
  Fault f;
  DebugComparison<const_unsigned_int_&,_unsigned_long> _kjCondition;
  Fault local_38;
  DebugComparison<const_unsigned_int_&,_unsigned_long> local_30;
  
  if (this->table == (HttpHeaderTable *)0x0) {
    local_30.left = &this->id;
    local_30.right = 0x11;
    local_30.op.content.ptr = " < ";
    local_30.op.content.size_ = 4;
    local_30.result = (ulong)this->id < 0x11;
    if (!local_30.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int_const&,unsigned_long>&>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x20d,FAILED,"id < kj::size(BUILTIN_HEADER_NAMES)","_kjCondition,",&local_30);
      kj::_::Debug::Fault::fatal(&local_38);
    }
    __s = *(char **)((anonymous_namespace)::BUILTIN_HEADER_NAMES + (ulong)this->id * 8);
    sVar2 = strlen(__s);
    sVar3 = sVar2 + 1;
  }
  else {
    pSVar1 = (this->table->namesById).builder.ptr;
    __s = pSVar1[this->id].content.ptr;
    sVar3 = pSVar1[this->id].content.size_;
  }
  SVar4.content.size_ = sVar3;
  SVar4.content.ptr = __s;
  return (StringPtr)SVar4.content;
}

Assistant:

kj::StringPtr HttpHeaderId::toString() const {
  if (table == nullptr) {
    KJ_ASSERT(id < kj::size(BUILTIN_HEADER_NAMES));
    return BUILTIN_HEADER_NAMES[id];
  } else {
    return table->idToString(*this);
  }
}